

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O3

int main(void)

{
  uint blocks;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  string method;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar2 = getenv("BLOCKS");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "BLOCKS not defined";
  }
  else {
    blocks = atoi(pcVar2);
    pcVar2 = getenv("METHOD");
    if (pcVar2 != (char *)0x0) {
      local_40[0] = local_30;
      sVar3 = strlen(pcVar2);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar2,pcVar2 + sVar3);
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if (iVar1 == 0) {
        uniform_sampling(blocks);
LAB_001060c1:
        if (local_40[0] != local_30) {
          operator_delete(local_40[0],local_30[0] + 1);
        }
        return 0;
      }
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if (iVar1 == 0) {
        canonic_sampling(blocks);
        goto LAB_001060c1;
      }
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if (iVar1 == 0) {
        wang_landau(blocks);
        goto LAB_001060c1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"METHOD not valid",0x10);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00106111;
    }
    pcVar2 = "METHOD not defined";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00106111:
  exit(1);
}

Assistant:

int main() {
    char *env_blocks = getenv("BLOCKS");
    if (env_blocks == NULL) {std::cout << "BLOCKS not defined" << std::endl; exit(1);}
    unsigned int blocks = (unsigned int)atoi(env_blocks);

    char *env_method = std::getenv("METHOD");
    if (env_method == NULL) {std::cout << "METHOD not defined" << std::endl; exit(1);}
    std::string method = std::string(env_method);

    if (method == "UniformSampling")
        uniform_sampling(blocks);
    else if (method == "CanonicSampling")
        canonic_sampling(blocks);
    else if (method == "WangLandau")
        wang_landau(blocks);
    else {
        std::cout << "METHOD not valid" << std::endl;
        exit(1);
    }
    return 0;
}